

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall
LinkedReadsDatastore::dump_tag_occupancy_histogram(LinkedReadsDatastore *this,string *filename)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  void *this_00;
  string *in_RSI;
  int i;
  pair<unsigned_int,_unsigned_int> *t;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range1_1;
  uint64_t *o;
  uint64_t *__end1;
  uint64_t *__begin1;
  uint64_t (*__range1) [10001];
  uint64_t oh [10001];
  ofstream tohf;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffec4c8;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_fffffffffffec4d0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffec4e0;
  uint uStack_13b14;
  int iStack_13b04;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  _Stack_13af0;
  LinkedReadsDatastore *in_stack_fffffffffffec518;
  undefined1 auStack_13ad8 [24];
  undefined1 *puStack_13ac0;
  ulong *puStack_13ab8;
  ulong *puStack_13ab0;
  ulong *puStack_13aa8;
  ulong *puStack_13aa0;
  ulong auStack_13a98 [10001];
  ulong local_210 [66];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_out);
  puStack_13ab0 = local_210;
  puStack_13aa0 = auStack_13a98;
  for (puStack_13aa8 = puStack_13aa0; puStack_13aa8 != puStack_13ab0;
      puStack_13aa8 = puStack_13aa8 + 1) {
    puStack_13ab8 = puStack_13aa8;
    *puStack_13aa8 = 0;
  }
  get_tag_readcount(in_stack_fffffffffffec518);
  puStack_13ac0 = auStack_13ad8;
  _Stack_13af0._M_current =
       (pair<unsigned_int,_unsigned_int> *)
       std::
       vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ::begin(in_stack_fffffffffffec4c8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::end(in_stack_fffffffffffec4c8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffec4d0,
                       (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                        *)in_stack_fffffffffffec4c8);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
             ::operator*(&_Stack_13af0);
    if (ppVar2->second < 0x2711) {
      uStack_13b14 = ppVar2->second;
    }
    else {
      uStack_13b14 = 10000;
    }
    auStack_13a98[uStack_13b14] = auStack_13a98[uStack_13b14] + 1;
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&_Stack_13af0);
  }
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(in_stack_fffffffffffec4e0);
  for (iStack_13b04 = 0; iStack_13b04 < 0x2711; iStack_13b04 = iStack_13b04 + 1) {
    if (auStack_13a98[iStack_13b04] != 0) {
      poVar3 = (ostream *)std::ostream::operator<<(local_210,iStack_13b04);
      poVar3 = std::operator<<(poVar3,",");
      this_00 = (void *)std::ostream::operator<<(poVar3,auStack_13a98[iStack_13b04]);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void LinkedReadsDatastore::dump_tag_occupancy_histogram(std::string filename) {
    std::ofstream tohf(filename);
    uint64_t oh[10001];
    for (auto &o:oh) o=0;
    for (auto &t:get_tag_readcount()){
        ++oh[(t.second>10000 ? 10000:t.second)];
    }
    for (auto i=0;i<10001;++i)
        if (oh[i]) tohf<<i<<","<<oh[i]<<std::endl;
}